

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef narrow_stripov(jit_State *J,TRef tr,int lastop,IRRef mode)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  IRIns *pIVar4;
  IRRef1 IVar5;
  TRef TVar6;
  TRef TVar7;
  ulong uVar8;
  long lVar9;
  
  IVar5 = (IRRef1)tr;
  uVar8 = (ulong)tr & 0xffff;
  pIVar4 = (J->cur).ir;
  bVar1 = *(byte *)((long)pIVar4 + uVar8 * 8 + 5);
  if (lastop < (int)(uint)bVar1 || bVar1 < 0x35) {
    if (((mode >> 0xb & 1) != 0) &&
       ((0x604208U >> (*(uint *)((long)pIVar4 + uVar8 * 8 + 4) & 0x1f) & 1) == 0)) {
      (J->fold).ins.field_0.ot = 0x5915;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = (IRRef1)mode;
      TVar6 = lj_opt_fold(J);
      return TVar6;
    }
  }
  else {
    lVar9 = 0x121;
    do {
      if ((((IRRef1)(&(J->cur).nextgc)[lVar9 * 2].gcptr32 == IVar5) &&
          (uVar3 = *(uint *)(&(J->cur).marked + lVar9 * 8), mode <= uVar3)) &&
         (((uVar3 ^ mode) & 0xfff) == 0)) {
        uVar2 = *(ushort *)((long)&(&(J->cur).nextgc)[lVar9 * 2].gcptr32 + 2);
        return *(int *)((long)pIVar4 + (ulong)uVar2 * 8 + 4) << 0x18 | (uint)uVar2;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x131);
    uVar2 = *(ushort *)((long)pIVar4 + uVar8 * 8 + 2);
    TVar6 = narrow_stripov(J,(uint)pIVar4[uVar8].field_0.op1,lastop,mode);
    TVar7 = narrow_stripov(J,(uint)uVar2,lastop,mode);
    (J->fold).ins.field_0.ot = (((ushort)(mode >> 5) & 0x1f) + (ushort)bVar1 * 0x100) - 0xc00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    tr = lj_opt_fold(J);
    uVar3 = J->bpropslot;
    J->bpropslot = uVar3 + 1 & 0xf;
    J->bpropcache[uVar3].key = IVar5;
    J->bpropcache[uVar3].val = (IRRef1)tr;
    J->bpropcache[uVar3].mode = mode;
  }
  return tr;
}

Assistant:

static TRef narrow_stripov(jit_State *J, TRef tr, int lastop, IRRef mode)
{
  IRRef ref = tref_ref(tr);
  IRIns *ir = IR(ref);
  int op = ir->o;
  if (op >= IR_ADDOV && op <= lastop) {
    BPropEntry *bp = narrow_bpc_get(J, ref, mode);
    if (bp) {
      return TREF(bp->val, irt_t(IR(bp->val)->t));
    } else {
      IRRef op1 = ir->op1, op2 = ir->op2;  /* The IR may be reallocated. */
      op1 = narrow_stripov(J, op1, lastop, mode);
      op2 = narrow_stripov(J, op2, lastop, mode);
      tr = emitir(IRT(op - IR_ADDOV + IR_ADD,
		      ((mode & IRCONV_DSTMASK) >> IRCONV_DSH)), op1, op2);
      narrow_bpc_set(J, ref, tref_ref(tr), mode);
    }
  } else if (LJ_64 && (mode & IRCONV_SEXT) && !irt_is64(ir->t)) {
    tr = emitir(IRT(IR_CONV, IRT_INTP), tr, mode);
  }
  return tr;
}